

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O2

bool __thiscall Hospital::Name_Validate(Hospital *this,string *Name)

{
  bool bVar1;
  ostream *poVar2;
  string *this_00;
  Hospital *this_01;
  string Name_1;
  
  this_01 = (Hospital *)&stack0xffffffffffffffc0;
  std::__cxx11::string::string((string *)this_01,(string *)Name);
  bVar1 = validate_String_Must_Be_character(this_01,(string *)&stack0xffffffffffffffc0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Your name must consist of numbers character !");
    std::endl<char,std::char_traits<char>>(poVar2);
    return false;
  }
  this_00 = (string *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string(this_00,(string *)Name);
  __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

bool Hospital :: Name_Validate(string Name){
    try {
        if(!validate_String_Must_Be_character(Name)){
            cout <<"Your name must consist of numbers character !"<<endl;
            return false;
        }
        else throw Name;
    }
    catch(string Name) {
        cout << "your Name entered successfully ."<<endl;
        return true;
    }
}